

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall google::protobuf::Symbol::GetFile(Symbol *this)

{
  Descriptor *pDVar1;
  
  switch(this->type) {
  case MESSAGE:
  case ENUM:
  case SERVICE:
    pDVar1 = (this->field_1).descriptor;
    break;
  case FIELD:
    return *(FileDescriptor **)((this->field_1).descriptor + 0x30);
  case ONEOF:
  case METHOD:
    pDVar1 = *(Descriptor **)((this->field_1).descriptor + 0x10);
    break;
  case ENUM_VALUE:
    pDVar1 = *(Descriptor **)((this->field_1).descriptor + 0x18);
    break;
  case PACKAGE:
    return (FileDescriptor *)(this->field_1).descriptor;
  default:
    return (FileDescriptor *)0x0;
  }
  return *(FileDescriptor **)(pDVar1 + 0x10);
}

Assistant:

const FileDescriptor* GetFile() const {
    switch (type) {
      case NULL_SYMBOL:
        return NULL;
      case MESSAGE:
        return descriptor->file();
      case FIELD:
        return field_descriptor->file();
      case ONEOF:
        return oneof_descriptor->containing_type()->file();
      case ENUM:
        return enum_descriptor->file();
      case ENUM_VALUE:
        return enum_value_descriptor->type()->file();
      case SERVICE:
        return service_descriptor->file();
      case METHOD:
        return method_descriptor->service()->file();
      case PACKAGE:
        return package_file_descriptor;
    }
    return NULL;
  }